

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_level_dm.cxx
# Opt level: O0

xr_surface * __thiscall
xray_re::xr_level_dm::create_surface(xr_level_dm *this,xr_raw_surface *raw_surface)

{
  xr_surface *this_00;
  string *psVar1;
  string *psVar2;
  xr_surface *surface;
  xr_raw_surface *raw_surface_local;
  xr_level_dm *this_local;
  
  this_00 = (xr_surface *)operator_new(0xd0);
  xr_surface::xr_surface(this_00,false);
  psVar1 = xr_dm::texture_abi_cxx11_(&this->super_xr_dm);
  psVar2 = xr_surface::texture_abi_cxx11_(this_00);
  std::__cxx11::string::operator=((string *)psVar2,(string *)psVar1);
  psVar1 = xr_dm::shader_abi_cxx11_(&this->super_xr_dm);
  psVar2 = xr_surface::eshader_abi_cxx11_(this_00);
  std::__cxx11::string::operator=((string *)psVar2,(string *)psVar1);
  xr_surface::set_two_sided(this_00);
  return this_00;
}

Assistant:

xr_surface* xr_level_dm::create_surface(const xr_raw_surface& raw_surface) const
{
	xr_surface* surface = new xr_surface;
	surface->texture() = texture();
	surface->eshader() = shader();
	surface->set_two_sided();
	return surface;
}